

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

bool __thiscall QtMWidgets::PickerPrivate::isRowsVisible(PickerPrivate *this,int start,int end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QPersistentModelIndex index;
  QPersistentModelIndex local_38 [8];
  
  iVar3 = this->itemsCount;
  iVar1 = Picker::count(this->q);
  iVar3 = (uint)(this->itemsCount < iVar1) + iVar3;
  QPersistentModelIndex::QPersistentModelIndex(local_38,&this->topItemIndex);
  iVar4 = 0;
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  while ((iVar1 != iVar4 &&
         ((iVar2 = QPersistentModelIndex::row(), iVar2 < start ||
          (iVar2 = QPersistentModelIndex::row(), end < iVar2))))) {
    makeNextIndex(this,local_38);
    iVar4 = iVar4 + 1;
  }
  QPersistentModelIndex::~QPersistentModelIndex(local_38);
  return iVar4 < iVar3;
}

Assistant:

bool
PickerPrivate::isRowsVisible( int start, int end )
{
	int visibleItemsCount = itemsCount;

	if( q->count() > itemsCount )
		++visibleItemsCount;

	QPersistentModelIndex index = topItemIndex;

	for( int i = 0; i < visibleItemsCount; ++i )
	{
		if( index.row() >= start && index.row() <= end )
			return true;

		makeNextIndex( index );
	}

	return false;
}